

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strcpy_s.c
# Opt level: O1

errno_t strcpy_s(char *s1,rsize_t s1max,char *s2)

{
  char cVar1;
  char *pcVar2;
  char *pcVar3;
  errno_t eVar4;
  long lVar5;
  
  if (((s1 == (char *)0x0) || ((long)s1max < 1)) || (s2 == (char *)0x0)) {
LAB_00109e74:
    if ((s1 != (char *)0x0) && (0 < (long)s1max)) {
      *s1 = '\0';
    }
    eVar4 = 0x16;
    (*_PDCLIB_constraint_handler)(_PDCLIB_lc_messages->errno_texts[0x16],(void *)0x0,0x16);
  }
  else {
    lVar5 = -s1max;
    pcVar2 = s1;
    pcVar3 = s2;
    do {
      lVar5 = lVar5 + 1;
      if (((lVar5 == 1) || (pcVar2 == s2)) || (pcVar3 == s1)) {
        s1max = -lVar5;
        goto LAB_00109e74;
      }
      cVar1 = *pcVar3;
      pcVar3 = pcVar3 + 1;
      *pcVar2 = cVar1;
      pcVar2 = pcVar2 + 1;
    } while (cVar1 != '\0');
    eVar4 = 0;
  }
  return eVar4;
}

Assistant:

errno_t strcpy_s( char * _PDCLIB_restrict s1, rsize_t s1max, const char * _PDCLIB_restrict s2 )
{
    char * dest = s1;
    const char * src = s2;

    if ( s1 != NULL && s2 != NULL && s1max <= RSIZE_MAX && s1max != 0 )
    {
        while ( s1max-- )
        {
            if ( dest == s2 || src == s1 )
            {
                goto runtime_constraint_violation;
            }

            if ( ( *dest++ = *src++ ) == '\0' )
            {
                return 0;
            }
        }
    }

runtime_constraint_violation:

    if ( s1 != NULL && s1max > 0 && s1max <= RSIZE_MAX )
    {
        s1[0] = '\0';
    }

    _PDCLIB_constraint_handler( _PDCLIB_CONSTRAINT_VIOLATION( _PDCLIB_EINVAL ) );
    return _PDCLIB_EINVAL;
}